

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

Status cmsys::SystemTools::CloneFileContent(string *source,string *destination)

{
  uint __fd;
  uint __fd_00;
  int iVar1;
  Status SVar2;
  
  __fd = open((source->_M_dataplus)._M_p,0);
  if (-1 < (int)__fd) {
    RemoveFile(destination);
    __fd_00 = open((destination->_M_dataplus)._M_p,0x241,0x180);
    if ((int)__fd_00 < 0) {
      SVar2 = Status::POSIX_errno();
    }
    else {
      SVar2.Kind_ = Success;
      SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      iVar1 = ioctl(__fd_00,0x40049409,(ulong)__fd);
      if (iVar1 < 0) {
        SVar2 = Status::POSIX_errno();
      }
      close(__fd);
      __fd = __fd_00;
    }
    close(__fd);
    return SVar2;
  }
  SVar2 = Status::POSIX_errno();
  return SVar2;
}

Assistant:

Status SystemTools::CloneFileContent(std::string const& source,
                                     std::string const& destination)
{
#if defined(__linux) && defined(FICLONE)
  int in = open(source.c_str(), O_RDONLY);
  if (in < 0) {
    return Status::POSIX_errno();
  }

  SystemTools::RemoveFile(destination);

  int out =
    open(destination.c_str(), O_WRONLY | O_CREAT | O_TRUNC, S_IRUSR | S_IWUSR);
  if (out < 0) {
    Status status = Status::POSIX_errno();
    close(in);
    return status;
  }

  Status status = Status::Success();
  if (ioctl(out, FICLONE, in) < 0) {
    status = Status::POSIX_errno();
  }
  close(in);
  close(out);

  return status;
#elif defined(__APPLE__) &&                                                   \
  defined(KWSYS_SYSTEMTOOLS_HAVE_MACOS_COPYFILE_CLONE)
  // NOTE: we cannot use `clonefile` as the {a,c,m}time for the file needs to
  // be updated by `copy_file_if_different` and `copy_file`.
  if (copyfile(source.c_str(), destination.c_str(), nullptr,
               COPYFILE_METADATA | COPYFILE_CLONE) < 0) {
    return Status::POSIX_errno();
  }
#  if KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, destination.c_str(), nullptr, 0) < 0) {
    return Status::POSIX_errno();
  }
#  else
  // fall back to utimes
  if (utimes(destination.c_str(), nullptr) < 0) {
    return Status::POSIX_errno();
  }
#  endif
  return Status::Success();
#else
  (void)source;
  (void)destination;
  return Status::POSIX(ENOSYS);
#endif
}